

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O2

bool re2::Regexp::Equal(Regexp *a,Regexp *b)

{
  byte bVar1;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar2;
  long lVar3;
  int i;
  ulong uVar4;
  bool bVar5;
  Regexp *b2;
  Regexp *a2;
  vector<re2::Regexp_*,_std::allocator<re2::Regexp_*>_> stk;
  Regexp *local_58;
  Regexp *local_50;
  _Vector_base<re2::Regexp_*,_std::allocator<re2::Regexp_*>_> local_48;
  
  if (a == (Regexp *)0x0 || b == (Regexp *)0x0) {
    bVar5 = a == b;
  }
  else {
    bVar5 = TopEqual(a,b);
    if (bVar5) {
      bVar1 = a->op_;
      bVar5 = true;
      if (bVar1 - 5 < 7) {
        local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        do {
          if (bVar1 - 7 < 5) {
            if (a->nsub_ < 2) {
              paVar2 = &a->field_5;
            }
            else {
              paVar2 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(a->field_5).submany_;
            }
            local_50 = paVar2->subone_;
            if (b->nsub_ < 2) {
              paVar2 = &b->field_5;
            }
            else {
              paVar2 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(b->field_5).submany_;
            }
            local_58 = paVar2->subone_;
            bVar5 = TopEqual(local_50,local_58);
            b = local_58;
            a = local_50;
            if (!bVar5) {
LAB_0019b42d:
              bVar5 = false;
LAB_0019b42f:
              std::_Vector_base<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>::~_Vector_base
                        (&local_48);
              return bVar5;
            }
          }
          else {
            if (bVar1 - 5 < 2) {
              for (uVar4 = 0; uVar4 < a->nsub_; uVar4 = uVar4 + 1) {
                paVar2 = &a->field_5;
                if (1 < a->nsub_) {
                  paVar2 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(a->field_5).submany_;
                }
                local_50 = paVar2[uVar4].subone_;
                paVar2 = &b->field_5;
                if (1 < b->nsub_) {
                  paVar2 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(b->field_5).submany_;
                }
                local_58 = paVar2[uVar4].subone_;
                bVar5 = TopEqual(local_50,local_58);
                if (!bVar5) goto LAB_0019b42d;
                std::vector<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>::push_back
                          ((vector<re2::Regexp_*,_std::allocator<re2::Regexp_*>_> *)&local_48,
                           &local_50);
                std::vector<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>::push_back
                          ((vector<re2::Regexp_*,_std::allocator<re2::Regexp_*>_> *)&local_48,
                           &local_58);
              }
            }
            if ((long)local_48._M_impl.super__Vector_impl_data._M_finish -
                (long)local_48._M_impl.super__Vector_impl_data._M_start == 0) {
              bVar5 = true;
              goto LAB_0019b42f;
            }
            lVar3 = (long)local_48._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_48._M_impl.super__Vector_impl_data._M_start >> 3;
            a = local_48._M_impl.super__Vector_impl_data._M_start[lVar3 + -2];
            b = local_48._M_impl.super__Vector_impl_data._M_finish[-1];
            std::vector<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>::resize
                      ((vector<re2::Regexp_*,_std::allocator<re2::Regexp_*>_> *)&local_48,lVar3 - 2)
            ;
          }
          bVar1 = a->op_;
        } while( true );
      }
    }
    else {
      bVar5 = false;
    }
  }
  return bVar5;
}

Assistant:

bool Regexp::Equal(Regexp* a, Regexp* b) {
  if (a == NULL || b == NULL)
    return a == b;

  if (!TopEqual(a, b))
    return false;

  // Fast path:
  // return without allocating vector if there are no subregexps.
  switch (a->op()) {
    case kRegexpAlternate:
    case kRegexpConcat:
    case kRegexpStar:
    case kRegexpPlus:
    case kRegexpQuest:
    case kRegexpRepeat:
    case kRegexpCapture:
      break;

    default:
      return true;
  }

  // Committed to doing real work.
  // The stack (vector) has pairs of regexps waiting to
  // be compared.  The regexps are only equal if
  // all the pairs end up being equal.
  std::vector<Regexp*> stk;

  for (;;) {
    // Invariant: TopEqual(a, b) == true.
    Regexp* a2;
    Regexp* b2;
    switch (a->op()) {
      default:
        break;
      case kRegexpAlternate:
      case kRegexpConcat:
        for (int i = 0; i < a->nsub(); i++) {
          a2 = a->sub()[i];
          b2 = b->sub()[i];
          if (!TopEqual(a2, b2))
            return false;
          stk.push_back(a2);
          stk.push_back(b2);
        }
        break;

      case kRegexpStar:
      case kRegexpPlus:
      case kRegexpQuest:
      case kRegexpRepeat:
      case kRegexpCapture:
        a2 = a->sub()[0];
        b2 = b->sub()[0];
        if (!TopEqual(a2, b2))
          return false;
        // Really:
        //   stk.push_back(a2);
        //   stk.push_back(b2);
        //   break;
        // but faster to assign directly and loop.
        a = a2;
        b = b2;
        continue;
    }

    size_t n = stk.size();
    if (n == 0)
      break;

    DCHECK_GE(n, 2);
    a = stk[n-2];
    b = stk[n-1];
    stk.resize(n-2);
  }

  return true;
}